

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutCut.c
# Opt level: O3

Cut_Cut_t * Cut_CutCreateTriv(Cut_Man_t *p,int Node)

{
  uint uVar1;
  Cut_Cut_t *pCVar2;
  long lVar3;
  int iVar4;
  
  iVar4 = Node << 8;
  if (p->pParams->fSeq == 0) {
    iVar4 = Node;
  }
  pCVar2 = Cut_CutAlloc(p);
  uVar1 = *(uint *)pCVar2;
  *(uint *)pCVar2 = uVar1 & 0xfffffff | 0x10000000;
  *(int *)(pCVar2 + 1) = iVar4;
  pCVar2->uSign = 1 << ((char)(iVar4 / 0x1f) * -0x1f + (char)iVar4 & 0x1fU);
  if ((p->pParams->fTruth != 0) && (0 < p->nTruthWords)) {
    lVar3 = 0;
    do {
      *(undefined4 *)(&pCVar2[1].field_0x0 + lVar3 * 4 + (ulong)(uVar1 >> 0x16 & 0x3c)) = 0xaaaaaaaa
      ;
      lVar3 = lVar3 + 1;
    } while (lVar3 < p->nTruthWords);
  }
  p->nCutsTriv = p->nCutsTriv + 1;
  return pCVar2;
}

Assistant:

Cut_Cut_t * Cut_CutCreateTriv( Cut_Man_t * p, int Node )
{
    Cut_Cut_t * pCut;
    if ( p->pParams->fSeq )
        Node <<= CUT_SHIFT;
    pCut = Cut_CutAlloc( p );
    pCut->nLeaves    = 1;
    pCut->pLeaves[0] = Node;
    pCut->uSign      = Cut_NodeSign( Node );
    if ( p->pParams->fTruth )
    {
/*
        if ( pCut->nVarsMax == 4 )
            Cut_CutWriteTruth( pCut, p->uTruthVars[0] );
        else
            Extra_BitCopy( pCut->nLeaves, p->uTruths[0], (uint8*)Cut_CutReadTruth(pCut) );
*/
        unsigned * pTruth = Cut_CutReadTruth(pCut);
        int i;
        for ( i = 0; i < p->nTruthWords; i++ )
            pTruth[i] = 0xAAAAAAAA;
    }
    p->nCutsTriv++;
    return pCut;
}